

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# about_panel.cxx
# Opt level: O0

Fl_Double_Window * make_about_panel(void)

{
  Fl_Widget *pFVar1;
  Fl_Image *img;
  Fl_Button *this;
  Fl_Return_Button *o_4;
  Fl_Button *o_3;
  Fl_Box *o_2;
  char about [80];
  Fl_Box *o_1;
  Fl_Box *o;
  
  pFVar1 = (Fl_Widget *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)pFVar1,0x159,0xb4,"About FLUID");
  about_panel = (Fl_Double_Window *)pFVar1;
  Fl_Widget::color(pFVar1,0x32);
  Fl_Widget::selection_color((Fl_Widget *)about_panel,0x2f);
  Fl_Window::hotspot(&about_panel->super_Fl_Window,(Fl_Widget *)about_panel,0);
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,10,10,0x73,0x78,(char *)0x0);
  img = image_fluid();
  Fl_Widget::image(pFVar1,img);
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,0x87,10,0xcd,0x4b,"FLTK User\nInterface Designer\nVersion x.x.x");
  about._72_8_ = pFVar1;
  Fl_Widget::color(pFVar1,0xc);
  Fl_Widget::selection_color((Fl_Widget *)about._72_8_,0x2f);
  Fl_Widget::labelfont((Fl_Widget *)about._72_8_,1);
  Fl_Widget::labelsize((Fl_Widget *)about._72_8_,0x12);
  Fl_Widget::align((Fl_Widget *)about._72_8_,0x15);
  snprintf((char *)&o_2,0x50,"FLTK User\nInterface Designer\nVersion %d.%d.%d",1,3,4);
  Fl_Widget::copy_label((Fl_Widget *)about._72_8_,(char *)&o_2);
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,0x87,0x5a,200,0x2d,
                 "Copyright 1998-2016 by\nBill Spitzak and others");
  Fl_Widget::align(pFVar1,0x94);
  this = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this,0x73,0x91,0x7b,0x19,"View License...");
  Fl_Widget::labelcolor((Fl_Widget *)this,0x88);
  Fl_Widget::callback((Fl_Widget *)this,cb_View);
  pFVar1 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar1,0xfa,0x91,0x53,0x19,"Close");
  Fl_Widget::callback(pFVar1,cb_Close);
  Fl_Window::set_non_modal(&about_panel->super_Fl_Window);
  Fl_Group::end((Fl_Group *)about_panel);
  return about_panel;
}

Assistant:

Fl_Double_Window* make_about_panel() {
  { about_panel = new Fl_Double_Window(345, 180, "About FLUID");
    about_panel->color(FL_LIGHT1);
    about_panel->selection_color(FL_DARK1);
    about_panel->hotspot(about_panel);
    { Fl_Box* o = new Fl_Box(10, 10, 115, 120);
      o->image( image_fluid() );
    } // Fl_Box* o
    { Fl_Box* o = new Fl_Box(135, 10, 205, 75, "FLTK User\nInterface Designer\nVersion x.x.x");
      o->color((Fl_Color)12);
      o->selection_color(FL_DARK1);
      o->labelfont(1);
      o->labelsize(18);
      o->align(Fl_Align(FL_ALIGN_TOP_LEFT|FL_ALIGN_INSIDE));
      char about[80]; // uses less than 60
      snprintf(about,sizeof(about),"FLTK User\nInterface Designer\nVersion %d.%d.%d",FL_MAJOR_VERSION,FL_MINOR_VERSION,FL_PATCH_VERSION);
      o->copy_label(about);
    } // Fl_Box* o
    { Fl_Box* o = new Fl_Box(135, 90, 200, 45, "Copyright 1998-2016 by\nBill Spitzak and others");
      o->align(Fl_Align(132|FL_ALIGN_INSIDE));
    } // Fl_Box* o
    { Fl_Button* o = new Fl_Button(115, 145, 123, 25, "View License...");
      o->labelcolor(FL_DARK_BLUE);
      o->callback((Fl_Callback*)cb_View);
    } // Fl_Button* o
    { Fl_Return_Button* o = new Fl_Return_Button(250, 145, 83, 25, "Close");
      o->callback((Fl_Callback*)cb_Close);
    } // Fl_Return_Button* o
    about_panel->set_non_modal();
    about_panel->end();
  } // Fl_Double_Window* about_panel
  return about_panel;
}